

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

anon_unknown_2 * __thiscall
google::anon_unknown_2::GetShortFlagLine
          (anon_unknown_2 *this,string *line_indentation,CommandLineFlagInfo *info)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *local_108;
  bool local_ba;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  string local_78 [8];
  string suffix;
  int remainder;
  string local_40 [7];
  bool is_string;
  string prefix;
  CommandLineFlagInfo *info_local;
  string *line_indentation_local;
  
  std::__cxx11::string::string(local_40);
  bVar1 = std::operator==(&info->type,"string");
  uVar4 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::c_str();
  pcVar6 = "";
  if (bVar1) {
    pcVar6 = "\'";
  }
  uVar7 = std::__cxx11::string::c_str();
  pcVar8 = "";
  if (bVar1) {
    pcVar8 = "\'";
  }
  SStringPrintf((string *)local_40,"%s--%s [%s%s%s] ",uVar4,uVar5,pcVar6,uVar7,pcVar8);
  iVar3 = fLI::FLAGS_tab_completion_columns;
  iVar2 = std::__cxx11::string::size();
  iVar3 = iVar3 - iVar2;
  std::__cxx11::string::string(local_78);
  if (0 < iVar3) {
    iVar2 = std::__cxx11::string::size();
    if (iVar2 <= iVar3) {
      local_108 = (char *)std::__cxx11::string::c_str();
    }
    else {
      std::__cxx11::string::substr((ulong)local_b8,(ulong)&info->description);
      std::operator+(local_98,(char *)local_b8);
      local_108 = (char *)std::__cxx11::string::c_str();
    }
    local_ba = iVar2 > iVar3;
    std::__cxx11::string::operator=(local_78,local_108);
    if (local_ba) {
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string(local_b8);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

static string GetShortFlagLine(
    const string &line_indentation,
    const CommandLineFlagInfo &info) {
  string prefix;
  bool is_string = (info.type == "string");
  SStringPrintf(&prefix, "%s--%s [%s%s%s] ",
                line_indentation.c_str(),
                info.name.c_str(),
                (is_string ? "'" : ""),
                info.default_value.c_str(),
                (is_string ? "'" : ""));
  int remainder =
      FLAGS_tab_completion_columns - static_cast<int>(prefix.size());
  string suffix;
  if (remainder > 0)
    suffix =
        (static_cast<int>(info.description.size()) > remainder ?
         (info.description.substr(0, remainder - 3) + "...").c_str() :
         info.description.c_str());
  return prefix + suffix;
}